

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::Int64Parameter::SerializeWithCachedSizes
          (Int64Parameter *this,CodedOutputStream *output)

{
  bool bVar1;
  int64 iVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Int64Parameter *this_local;
  
  iVar2 = defaultvalue(this);
  if (iVar2 != 0) {
    iVar2 = defaultvalue(this);
    google::protobuf::internal::WireFormatLite::WriteInt64(1,iVar2,output);
  }
  bVar1 = has_range(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&((this->AllowedValues_).range_)->super_MessageLite,output);
  }
  bVar1 = has_set(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xb,&((this->AllowedValues_).range_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void Int64Parameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Int64Parameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 defaultValue = 1;
  if (this->defaultvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(1, this->defaultvalue(), output);
  }

  // .CoreML.Specification.Int64Range range = 10;
  if (has_range()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *AllowedValues_.range_, output);
  }

  // .CoreML.Specification.Int64Set set = 11;
  if (has_set()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      11, *AllowedValues_.set_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Int64Parameter)
}